

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void get_supertiles(tgestate_t *state)

{
  int iVar1;
  byte bVar2;
  ulong uVar3;
  char cVar4;
  supertileindex_t *__src;
  supertileindex_t *__dest;
  
  bVar2 = (state->map_position).y;
  iVar1 = (bVar2 & 0xfffffffc) + (uint)(bVar2 >> 2) * 2;
  uVar3 = (ulong)((state->map_position).x >> 2);
  __src = map + uVar3 + (uint)(iVar1 * 9) + -0x36;
  cVar4 = (char)state->st_rows -
          ("" < map + (long)state->st_columns +
                      (long)(state->st_rows * 0x36 + -0x36) + uVar3 + (uint)(iVar1 * 9) + -0x36);
  __dest = state->map_buf;
  do {
    memcpy(__dest,__src,(long)state->st_columns);
    __dest = __dest + state->st_columns;
    __src = __src + 0x36;
    cVar4 = cVar4 + -1;
  } while (cVar4 != '\0');
  check_map_buf(state);
  return;
}

Assistant:

void get_supertiles(tgestate_t *state)
{
  uint8_t                 v;     /* was A */
  const supertileindex_t *tiles; /* was HL */
  uint8_t                 iters; /* was A */
  uint8_t                *buf;   /* was DE */

  assert(state != NULL);

  /* Get vertical offset. */
  v = state->map_position.y & ~3; /* = 0, 4, 8, 12, ... */

  /* Multiply 'v' by (MAPX / 4) (= 13.5 = 1.5 * 9).
   * 'v' is a multiple of 4, so this goes 0, 54, 108, 162, ...)
   * MAPX is subtracted to skip the first row. */
  tiles = &map[0] - MAPX + (v + (v >> 1)) * 9;

  /* Add horizontal offset. */
  tiles += state->map_position.x >> 2;

  iters = state->st_rows;
  /* Conv: Avoid reading outside the map bounds. */
  if ((tiles + ((state->st_rows - 1) * MAPX) + state->st_columns) > &map[MAPX * MAPY])
    iters--;

  /* Populate map_buf with 7x5 array of supertile refs. */
  buf = &state->map_buf[0];
  do
  {
    ASSERT_MAP_PTR_VALID(tiles);
    memcpy(buf, tiles, state->st_columns);
    buf   += state->st_columns;
    tiles += MAPX;
  }
  while (--iters);

  check_map_buf(state);
}